

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QDBusIntrospection::Argument>::moveAppend
          (QGenericArrayOps<QDBusIntrospection::Argument> *this,Argument *b,Argument *e)

{
  qsizetype *pqVar1;
  Argument *pAVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  qint64 qVar7;
  
  if ((b != e) && (b < e)) {
    pAVar2 = (this->super_QArrayDataPointer<QDBusIntrospection::Argument>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QDBusIntrospection::Argument>).size;
      qVar7 = (b->location).columnNumber;
      pAVar2[lVar3].location.lineNumber = (b->location).lineNumber;
      pAVar2[lVar3].location.columnNumber = qVar7;
      pDVar4 = (b->type).d.d;
      (b->type).d.d = (Data *)0x0;
      pAVar2[lVar3].type.d.d = pDVar4;
      pcVar5 = (b->type).d.ptr;
      (b->type).d.ptr = (char16_t *)0x0;
      pAVar2[lVar3].type.d.ptr = pcVar5;
      qVar6 = (b->type).d.size;
      (b->type).d.size = 0;
      pAVar2[lVar3].type.d.size = qVar6;
      pDVar4 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pAVar2[lVar3].name.d.d = pDVar4;
      pcVar5 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pAVar2[lVar3].name.d.ptr = pcVar5;
      qVar6 = (b->name).d.size;
      (b->name).d.size = 0;
      pAVar2[lVar3].name.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QDBusIntrospection::Argument>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }